

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int BN_set_bit(BIGNUM *a,int n)

{
  BIGNUM *pBVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (-1 < n) {
    uVar2 = (uint)n >> 6;
    if (a->top <= (int)uVar2) {
      pBVar1 = a;
      if (a->dmax <= (int)uVar2) {
        pBVar1 = bn_expand2(a,uVar2 + 1);
      }
      if (pBVar1 == (BIGNUM *)0x0) {
        return 0;
      }
      iVar3 = a->top;
      if (iVar3 <= (int)uVar2) {
        memset(a->d + iVar3,0,(ulong)(uVar2 - iVar3) * 8 + 8);
      }
      a->top = uVar2 + 1;
    }
    a->d[uVar2] = a->d[uVar2] | 1L << ((byte)n & 0x3f);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int BN_set_bit(BIGNUM *a, int n)
{
    int i, j, k;

    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i) {
        if (bn_wexpand(a, i + 1) == NULL)
            return (0);
        for (k = a->top; k < i + 1; k++)
            a->d[k] = 0;
        a->top = i + 1;
    }

    a->d[i] |= (((BN_ULONG)1) << j);
    bn_check_top(a);
    return (1);
}